

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

size_t der_len_len(size_t len)

{
  undefined8 local_20;
  size_t ret;
  size_t len_local;
  
  if (len < 0x80) {
    len_local = 1;
  }
  else {
    local_20 = 1;
    for (ret = len; ret != 0; ret = ret >> 8) {
      local_20 = local_20 + 1;
    }
    len_local = local_20;
  }
  return len_local;
}

Assistant:

static size_t der_len_len(size_t len) {
  if (len < 0x80) {
    return 1;
  }
  size_t ret = 1;
  while (len > 0) {
    ret++;
    len >>= 8;
  }
  return ret;
}